

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
cs_impl::
try_convert_and_check<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
::convert(var *val)

{
  char *__s1;
  int iVar1;
  undefined4 extraout_var;
  undefined *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  runtime_error *this;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (val->mDat == (proxy *)0x0) {
    puVar2 = &void::typeinfo;
  }
  else {
    iVar1 = (*val->mDat->data->_vptr_baseHolder[2])();
    puVar2 = (undefined *)CONCAT44(extraout_var,iVar1);
  }
  __s1 = *(char **)(puVar2 + 8);
  if (__s1 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
      if (iVar1 == 0) goto LAB_001fd8f5;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string(&local_a8,1);
    std::operator+(&local_88,"Invalid Argument. At ",&local_a8);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_128._M_dataplus._M_p = (pointer)*plVar4;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_128._M_dataplus._M_p == psVar5) {
      local_128.field_2._M_allocated_capacity = *psVar5;
      local_128.field_2._8_8_ = plVar4[3];
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar5;
    }
    local_128._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    cxx_demangle_abi_cxx11_
              (&local_c8,(cs_impl *)"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE",
               (char *)local_128._M_string_length);
    std::operator+(&local_68,&local_128,&local_c8);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
    local_108._M_dataplus._M_p = (pointer)*plVar4;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_108._M_dataplus._M_p == psVar5) {
      local_108.field_2._M_allocated_capacity = *psVar5;
      local_108.field_2._8_8_ = plVar4[3];
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar5;
    }
    local_108._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    any::get_type_name_abi_cxx11_(&local_e8,val);
    std::operator+(&local_48,&local_108,&local_e8);
    cs::runtime_error::runtime_error(this,&local_48);
    __cxa_throw(this,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
LAB_001fd8f5:
  pbVar3 = any::const_val<std::__cxx11::string>(val);
  return pbVar3;
}

Assistant:

inline static _TargetT convert(cs::var &val)
		{
			if (val.type() == typeid(_TargetT))
				return convert_helper<_TargetT>::get_val(val);
			else
				throw cs::runtime_error("Invalid Argument. At " + std::to_string(index + 1) + ". Expected " +
				                        cxx_demangle(get_name_of_type<_TargetT>()) + ", provided " +
				                        val.get_type_name());
		}